

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int kwsysProcessSetupOutputPipeFile(int *p,char *name)

{
  int __fd;
  int iVar1;
  int iVar2;
  
  kwsysProcessCleanupDescriptor(p);
  iVar2 = 0;
  __fd = open(name,0x241,0x1b6);
  if (-1 < __fd) {
    iVar2 = 0;
    iVar1 = fcntl(__fd,2,1);
    if (iVar1 < 0) {
      close(__fd);
    }
    else {
      *p = __fd;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int kwsysProcessSetupOutputPipeFile(int* p, const char* name)
{
  int fout;
  if (!name) {
    return 1;
  }

  /* Close the existing descriptor.  */
  kwsysProcessCleanupDescriptor(p);

  /* Open a file for the pipe to write.  */
  if ((fout = open(name, O_WRONLY | O_CREAT | O_TRUNC, 0666)) < 0) {
    return 0;
  }

  /* Set close-on-exec flag on the pipe's end.  */
  if (fcntl(fout, F_SETFD, FD_CLOEXEC) < 0) {
    close(fout);
    return 0;
  }

  /* Assign the replacement descriptor.  */
  *p = fout;
  return 1;
}